

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandDrwsat(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  char *pcVar3;
  uint fVerbose;
  uint fBalance;
  char *pcVar4;
  
  pAVar2 = Abc_FrameReadNtk(pAbc);
  fBalance = 0;
  Extra_UtilGetoptReset();
  fVerbose = 0;
  while( true ) {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"bvh"), iVar1 == 0x76) {
      fVerbose = fVerbose ^ 1;
    }
    if (iVar1 == -1) break;
    if (iVar1 != 0x62) {
      Abc_Print(-2,"usage: drwsat [-bvh]\n");
      Abc_Print(-2,"\t         performs combinational AIG optimization for SAT\n");
      pcVar4 = "yes";
      pcVar3 = "yes";
      if (fBalance == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-b     : toggle internal balancing [default = %s]\n",pcVar3);
      if (fVerbose == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle verbose printout [default = %s]\n",pcVar4);
      pcVar3 = "\t-h     : print the command usage\n";
      iVar1 = -2;
LAB_0025e5ab:
      Abc_Print(iVar1,pcVar3);
      return 1;
    }
    fBalance = fBalance ^ 1;
  }
  if (pAVar2 == (Abc_Ntk_t *)0x0) {
    pcVar3 = "Empty network.\n";
  }
  else {
    if (pAVar2->ntkType == ABC_NTK_STRASH) {
      pAVar2 = Abc_NtkDrwsat(pAVar2,fBalance,fVerbose);
      if (pAVar2 != (Abc_Ntk_t *)0x0) {
        Abc_FrameReplaceCurrentNetwork(pAbc,pAVar2);
        return 0;
      }
      Abc_Print(-1,"Command has failed.\n");
      return 0;
    }
    pcVar3 = "This command works only for strashed networks.\n";
  }
  iVar1 = -1;
  goto LAB_0025e5ab;
}

Assistant:

int Abc_CommandDrwsat( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes;
    int fBalance, fVerbose, c;

    extern Abc_Ntk_t * Abc_NtkDrwsat( Abc_Ntk_t * pNtk, int fBalance, int fVerbose );

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    fBalance = 0;
    fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "bvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'b':
            fBalance ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "This command works only for strashed networks.\n" );
        return 1;
    }
    pNtkRes = Abc_NtkDrwsat( pNtk, fBalance, fVerbose );
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Command has failed.\n" );
        return 0;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: drwsat [-bvh]\n" );
    Abc_Print( -2, "\t         performs combinational AIG optimization for SAT\n" );
    Abc_Print( -2, "\t-b     : toggle internal balancing [default = %s]\n", fBalance? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle verbose printout [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}